

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O1

Curve * Assimp::IFC::Curve::Convert(IfcCurve *curve,ConversionData *conv)

{
  undefined8 *puVar1;
  iterator __position;
  DataType *pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  IfcCurve *pIVar10;
  Curve *pCVar11;
  IfcCartesianPoint *pIVar12;
  IfcConic *pIVar13;
  Conic *pCVar14;
  IfcVector *in;
  IfcCurve *curve_00;
  Curve *pCVar15;
  ulong uVar16;
  IfcCompositeCurveSegment *pIVar17;
  element_type *peVar18;
  string *psVar19;
  undefined8 uVar20;
  undefined8 *puVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _func_int *p_Var22;
  double dVar23;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  IfcVector3 point;
  shared_ptr<Assimp::IFC::Curve> cv;
  undefined1 local_b8 [8];
  _Alloc_hider _Stack_b0;
  _func_int *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  Curve *local_88;
  undefined8 *local_80;
  vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
  *local_78;
  IfcCurve *local_70;
  undefined1 local_68 [16];
  double local_58;
  IfcCurve *local_50;
  Curve *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  long local_38;
  
  pCVar11 = (Curve *)((long)&(curve->super_IfcGeometricRepresentationItem).
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             ._vptr_ObjectHelper +
                     (long)(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem
                           .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           _vptr_ObjectHelper[-3]);
  lVar9 = __dynamic_cast(pCVar11,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcBoundedCurve::typeinfo
                         ,0xffffffffffffffff);
  if (lVar9 != 0) {
    local_50 = curve;
    pIVar10 = (IfcCurve *)
              __dynamic_cast(pCVar11,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcPolyline::typeinfo
                             ,0xffffffffffffffff);
    if (pIVar10 != (IfcCurve *)0x0) {
      pCVar11 = (Curve *)operator_new(0x30);
      pCVar11->base_entity = pIVar10;
      pCVar11->conv = conv;
      pCVar11->_vptr_Curve = (_func_int **)&PTR__PolyLine_008f2e90;
      pCVar11[1]._vptr_Curve = 0;
      pCVar11[1].base_entity = (IfcCurve *)0x0;
      pCVar11[1].conv = (ConversionData *)0x0;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)(pCVar11 + 1),
                 *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           field_0x10 -
                 *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           field_0x8 >> 3);
      local_b8 = (undefined1  [8])0x0;
      _Stack_b0._M_p = (pointer)0x0;
      local_a8 = (_func_int *)0x0;
      puVar21 = *(undefined8 **)
                 &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8;
      puVar1 = *(undefined8 **)
                &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
      if (puVar21 != puVar1) {
        do {
          pIVar12 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                              ((LazyObject *)*puVar21);
          ConvertCartesianPoint((IfcVector3 *)local_b8,pIVar12);
          __position._M_current = (aiVector3t<double> *)pCVar11[1].base_entity;
          if (__position._M_current == (aiVector3t<double> *)pCVar11[1].conv) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                       (pCVar11 + 1),__position,(IfcVector3 *)local_b8);
          }
          else {
            (__position._M_current)->z = (double)local_a8;
            (__position._M_current)->x = (double)local_b8;
            (__position._M_current)->y = (double)_Stack_b0._M_p;
            pCVar11[1].base_entity = (IfcCurve *)((long)pCVar11[1].base_entity + 0x18);
          }
          puVar21 = puVar21 + 1;
        } while (puVar21 != puVar1);
      }
    }
    curve = local_50;
    if (pIVar10 != (IfcCurve *)0x0) {
      return pCVar11;
    }
    pIVar10 = (IfcCurve *)
              __dynamic_cast((_func_int *)
                             ((long)&(local_50->super_IfcGeometricRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     ._vptr_ObjectHelper +
                             (long)(local_50->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                             &IFC::Schema_2x3::IfcTrimmedCurve::typeinfo);
    if (pIVar10 != (IfcCurve *)0x0) {
      pCVar11 = (Curve *)operator_new(0x48);
      pCVar11->base_entity = pIVar10;
      pCVar11->conv = conv;
      pCVar11->_vptr_Curve = (_func_int **)&PTR__TrimmedCurve_008f2ef8;
      pCVar11[1]._vptr_Curve = 0;
      pCVar11[1].base_entity = (IfcCurve *)0x0;
      curve_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>
                           (*(LazyObject **)
                             &pIVar10[1].super_IfcGeometricRepresentationItem.
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              .field_0x8);
      pCVar15 = Convert(curve_00,conv);
      pCVar11[2].base_entity = (IfcCurve *)pCVar15;
      local_38 = (long)&pCVar11[2].conv;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::Curve*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,pCVar15);
      local_88 = pCVar11 + 1;
      local_68._0_8_ = (element_type *)0x0;
      local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = 0.0;
      puVar21 = *(undefined8 **)
                 &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10
      ;
      puVar1 = *(undefined8 **)
                &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
      local_70 = pIVar10;
      if (puVar21 == puVar1) {
        uVar16 = 0;
        puVar21 = (undefined8 *)0x0;
      }
      else {
        local_80 = (undefined8 *)0x0;
        local_78 = (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
                    *)((ulong)local_78 & 0xffffffff00000000);
        do {
          pDVar2 = (DataType *)*puVar21;
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar21[1];
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          uVar20 = 0;
          lVar9 = __dynamic_cast(pDVar2,&STEP::EXPRESS::DataType::typeinfo,
                                 &STEP::EXPRESS::PrimitiveDataType<double>::typeinfo,0);
          if (lVar9 == 0) {
            pIVar12 = STEP::EXPRESS::DataType::
                      ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcCartesianPoint>(pDVar2,conv->db);
            if (pIVar12 != (IfcCartesianPoint *)0x0) {
              local_78 = (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
                          *)CONCAT44(local_78._4_4_,(int)CONCAT71((int7)((ulong)uVar20 >> 8),1));
              ConvertCartesianPoint((IfcVector3 *)local_68,pIVar12);
            }
          }
          else {
            local_88->_vptr_Curve = *(_func_int ***)(lVar9 + 8);
            local_80 = (undefined8 *)CONCAT71((int7)((ulong)local_88 >> 8),1);
          }
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
        } while ((lVar9 == 0) && (puVar21 = puVar21 + 2, puVar21 != puVar1));
        uVar16 = (ulong)local_78 & 0xffffffff;
        puVar21 = local_80;
      }
      pIVar10 = local_70;
      if ((((ulong)puVar21 & 1) == 0) &&
         (((uVar16 & 1) == 0 ||
          (cVar5 = (**(code **)(*(long *)pCVar11[2].base_entity + 0x20))
                             (pCVar11[2].base_entity,local_68,local_88), cVar5 == '\0')))) {
        psVar19 = (string *)__cxa_allocate_exception(0x20);
        local_b8 = (undefined1  [8])&local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,
                   "IfcTrimmedCurve: failed to read first trim parameter, ignoring curve","");
        *(string **)psVar19 = psVar19 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar19,local_b8,_Stack_b0._M_p + (long)local_b8);
        __cxa_throw(psVar19,&CurveError::typeinfo,CurveError::~CurveError);
      }
      puVar21 = *(undefined8 **)&pIVar10[1].super_IfcGeometricRepresentationItem.field_0x28;
      puVar1 = *(undefined8 **)&pIVar10[1].super_IfcGeometricRepresentationItem.field_0x30;
      if (puVar21 == puVar1) {
        uVar7 = 0;
        pCVar15 = (Curve *)0x0;
      }
      else {
        local_88 = (Curve *)0x0;
        local_80 = (undefined8 *)((ulong)local_80 & 0xffffffff00000000);
        do {
          pDVar2 = (DataType *)*puVar21;
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar21[1];
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          uVar20 = 0;
          lVar9 = __dynamic_cast(pDVar2,&STEP::EXPRESS::DataType::typeinfo,
                                 &STEP::EXPRESS::PrimitiveDataType<double>::typeinfo,0);
          if (lVar9 == 0) {
            pIVar12 = STEP::EXPRESS::DataType::
                      ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcCartesianPoint>(pDVar2,conv->db);
            if (pIVar12 != (IfcCartesianPoint *)0x0) {
              local_80 = (undefined8 *)
                         CONCAT44(local_80._4_4_,(int)CONCAT71((int7)((ulong)uVar20 >> 8),1));
              ConvertCartesianPoint((IfcVector3 *)local_68,pIVar12);
            }
          }
          else {
            pCVar11[1].base_entity = (IfcCurve *)*(undefined8 *)(lVar9 + 8);
            local_88 = (Curve *)CONCAT71((int7)((ulong)lVar9 >> 8),1);
          }
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
        } while ((lVar9 == 0) && (puVar21 = puVar21 + 2, puVar21 != puVar1));
        pCVar15 = local_88;
        pIVar10 = local_70;
        uVar7 = (uint)local_80;
      }
      curve = local_50;
      if ((((ulong)pCVar15 & 1) == 0) &&
         (((uVar7 & 1) == 0 ||
          (cVar5 = (**(code **)(*(long *)pCVar11[2].base_entity + 0x20))
                             (pCVar11[2].base_entity,local_68,&pCVar11[1].base_entity),
          cVar5 == '\0')))) {
        psVar19 = (string *)__cxa_allocate_exception(0x20);
        local_b8 = (undefined1  [8])&local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,
                   "IfcTrimmedCurve: failed to read second trim parameter, ignoring curve","");
        *(string **)psVar19 = psVar19 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar19,local_b8,_Stack_b0._M_p + (long)local_b8);
        __cxa_throw(psVar19,&CurveError::typeinfo,CurveError::~CurveError);
      }
      local_b8 = (undefined1  [8])&PTR__PrimitiveDataType_008f31f0;
      _Stack_b0._M_p = (pointer)&local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_b0,*(long *)&pIVar10[1].field_0x40,
                 (long)pIVar10[2].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                       _vptr_ObjectHelper + *(long *)&pIVar10[1].field_0x40);
      local_b8 = (undefined1  [8])&PTR__PrimitiveDataType_008f31b8;
      bVar6 = IsTrue((BOOLEAN *)local_b8);
      *(bool *)(pCVar11 + 2) = bVar6;
      local_b8 = (undefined1  [8])&PTR__PrimitiveDataType_008f31f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_b0._M_p != &local_a0) {
        operator_delete(_Stack_b0._M_p,local_a0._M_allocated_capacity + 1);
      }
      if (*(char *)(pCVar11 + 2) == '\0') {
        uVar20 = pCVar11[1]._vptr_Curve;
        in_XMM1_Qa = (double)pCVar11[1].base_entity;
        *(double *)(pCVar11 + 1) = in_XMM1_Qa;
        pCVar11[1].base_entity = (IfcCurve *)uVar20;
      }
      cVar5 = (**(code **)(*(long *)pCVar11[2].base_entity + 0x10))();
      if ((cVar5 != '\0') &&
         ((double)pCVar11[1].base_entity <= *(double *)(pCVar11 + 1) &&
          *(double *)(pCVar11 + 1) != (double)pCVar11[1].base_entity)) {
        dVar23 = (double)(**(code **)(*(long *)pCVar11[2].base_entity + 0x28))();
        pCVar11[1].base_entity =
             (IfcCurve *)(ABS(in_XMM1_Qa - dVar23) + (double)pCVar11[1].base_entity);
      }
      dVar23 = (double)pCVar11[1].base_entity - *(double *)(pCVar11 + 1);
      pCVar11[1].conv = (ConversionData *)dVar23;
      in_XMM1_Qa = 0.0;
      if (dVar23 < 0.0) {
        __assert_fail("maxval >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                      ,0x176,
                      "Assimp::IFC::(anonymous namespace)::TrimmedCurve::TrimmedCurve(const Schema_2x3::IfcTrimmedCurve &, ConversionData &)"
                     );
      }
    }
    if (pIVar10 != (IfcCurve *)0x0) {
      return pCVar11;
    }
    pIVar10 = (IfcCurve *)
              __dynamic_cast((_func_int *)
                             ((long)&(curve->super_IfcGeometricRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     ._vptr_ObjectHelper +
                             (long)(curve->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                             &IFC::Schema_2x3::IfcCompositeCurve::typeinfo,0xffffffffffffffff);
    if (pIVar10 != (IfcCurve *)0x0) {
      pCVar11 = (Curve *)operator_new(0x38);
      pCVar11->base_entity = pIVar10;
      pCVar11->conv = conv;
      pCVar11->_vptr_Curve = (_func_int **)&PTR__CompositeCurve_008f2f60;
      local_78 = (vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
                  *)(pCVar11 + 1);
      pCVar11[1]._vptr_Curve = 0;
      pCVar11[1].base_entity = (IfcCurve *)0x0;
      pCVar11[1].conv = (ConversionData *)0x0;
      pCVar11[2]._vptr_Curve = 0;
      local_88 = pCVar11;
      std::
      vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
      ::reserve((vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
                 *)local_78,
                *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          field_0x10 -
                *(long *)&pIVar10[1].super_IfcGeometricRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          field_0x8 >> 3);
      puVar21 = *(undefined8 **)
                 &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8;
      local_80 = *(undefined8 **)
                  &pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   field_0x10;
      local_70 = pIVar10;
      if (puVar21 != local_80) {
        do {
          pIVar17 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCompositeCurveSegment>
                              ((LazyObject *)*puVar21);
          pIVar10 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>
                              ((pIVar17->ParentCurve).obj);
          local_48 = Convert(pIVar10,conv);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IFC::Curve*>
                    (&local_40,local_48);
          if (local_48 == (Curve *)0x0) {
            peVar18 = (element_type *)0x0;
          }
          else {
            peVar18 = (element_type *)__dynamic_cast(local_48,&typeinfo,&BoundedCurve::typeinfo,0);
          }
          pCVar11 = local_88;
          if (peVar18 == (element_type *)0x0) {
            this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            peVar18 = (element_type *)0x0;
          }
          else {
            this._M_pi = local_40._M_pi;
            if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
              }
            }
          }
          if (peVar18 == (element_type *)0x0) {
            LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5d2130);
          }
          else {
            lVar9 = *(long *)&(pIVar17->super_IfcGeometricRepresentationItem).field_0x30;
            local_b8 = (undefined1  [8])&local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b8,lVar9,*(long *)&pIVar17->field_0x38 + lVar9);
            iVar8 = std::__cxx11::string::compare((char *)local_b8);
            if (local_b8 != (undefined1  [8])&local_a8) {
              operator_delete((void *)local_b8,(ulong)(local_a8 + 1));
            }
            pCVar11 = local_88;
            if (iVar8 != 0) {
              LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5d20c0);
            }
            local_b8 = (undefined1  [8])&PTR__PrimitiveDataType_008f31f0;
            pcVar4 = (pIVar17->SameSense)._M_dataplus._M_p;
            _Stack_b0._M_p = (pointer)&local_a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_b0,pcVar4,pcVar4 + (pIVar17->SameSense)._M_string_length);
            local_b8 = (undefined1  [8])&PTR__PrimitiveDataType_008f31b8;
            bVar6 = IsTrue((BOOLEAN *)local_b8);
            if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
              }
            }
            local_58 = (double)CONCAT71(local_58._1_7_,bVar6);
            local_68._0_8_ = peVar18;
            local_68._8_8_ = this._M_pi;
            std::
            vector<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>,std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>>
            ::emplace_back<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,bool>>
                      (local_78,(pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool> *)local_68);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
            }
            local_b8 = (undefined1  [8])&PTR__PrimitiveDataType_008f31f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Stack_b0._M_p != &local_a0) {
              operator_delete(_Stack_b0._M_p,local_a0._M_allocated_capacity + 1);
            }
            (*(peVar18->super_Curve)._vptr_Curve[5])(peVar18);
            in_XMM1_Qa = ABS(in_XMM1_Qa - extraout_XMM0_Qa) + *(double *)(pCVar11 + 2);
            *(double *)(pCVar11 + 2) = in_XMM1_Qa;
          }
          if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
          }
          if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
          }
          puVar21 = puVar21 + 1;
        } while (puVar21 != local_80);
      }
      curve = local_50;
      pIVar10 = local_70;
      if ((IfcCurve *)*(long *)(pCVar11 + 1) == pCVar11[1].base_entity) {
        psVar19 = (string *)__cxa_allocate_exception(0x20);
        local_b8 = (undefined1  [8])&local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"empty composite curve","");
        *(string **)psVar19 = psVar19 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar19,local_b8,_Stack_b0._M_p + (long)local_b8);
        __cxa_throw(psVar19,&CurveError::typeinfo,CurveError::~CurveError);
      }
    }
    if (pIVar10 != (IfcCurve *)0x0) {
      return pCVar11;
    }
  }
  p_Var22 = (_func_int *)
            ((long)&(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]);
  lVar9 = __dynamic_cast(p_Var22,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcConic::typeinfo,
                         0xffffffffffffffff);
  if (lVar9 != 0) {
    pIVar13 = (IfcConic *)
              __dynamic_cast(p_Var22,&STEP::Object::typeinfo,&IFC::Schema_2x3::IfcCircle::typeinfo,
                             0xffffffffffffffff);
    if (pIVar13 != (IfcConic *)0x0) {
      pCVar14 = (Conic *)operator_new(0x80);
      anon_unknown_9::Conic::Conic(pCVar14,pIVar13,conv);
      (pCVar14->super_Curve)._vptr_Curve = (_func_int **)&PTR__Curve_008f2fc8;
      pCVar14[1].super_Curve._vptr_Curve = (_func_int **)pIVar13;
      return &pCVar14->super_Curve;
    }
    pIVar13 = (IfcConic *)
              __dynamic_cast((_func_int *)
                             ((long)&(curve->super_IfcGeometricRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     ._vptr_ObjectHelper +
                             (long)(curve->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                             &IFC::Schema_2x3::IfcEllipse::typeinfo,0xffffffffffffffff);
    if (pIVar13 != (IfcConic *)0x0) {
      pCVar14 = (Conic *)operator_new(0x80);
      anon_unknown_9::Conic::Conic(pCVar14,pIVar13,conv);
      (pCVar14->super_Curve)._vptr_Curve = (_func_int **)&PTR__Curve_008f3098;
      pCVar14[1].super_Curve._vptr_Curve = (_func_int **)pIVar13;
      return &pCVar14->super_Curve;
    }
  }
  pIVar10 = (IfcCurve *)
            __dynamic_cast((_func_int *)
                           ((long)&(curve->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   ._vptr_ObjectHelper +
                           (long)(curve->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                           &IFC::Schema_2x3::IfcLine::typeinfo,0xffffffffffffffff);
  if (pIVar10 == (IfcCurve *)0x0) {
    pCVar11 = (Curve *)0x0;
  }
  else {
    pCVar11 = (Curve *)operator_new(0x48);
    pCVar11->base_entity = pIVar10;
    pCVar11->conv = conv;
    pCVar11->_vptr_Curve = (_func_int **)&PTR__Curve_008f3100;
    pCVar11[1]._vptr_Curve = 0;
    pCVar11[1].base_entity = (IfcCurve *)0x0;
    pCVar11[1].conv = (ConversionData *)0x0;
    pCVar11[2]._vptr_Curve = 0;
    pCVar11[2].base_entity = (IfcCurve *)0x0;
    pCVar11[2].conv = (ConversionData *)0x0;
    pIVar12 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                        (*(LazyObject **)&pIVar10->field_0x40);
    ConvertCartesianPoint((IfcVector3 *)(pCVar11 + 1),pIVar12);
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcVector>
                   ((LazyObject *)
                    pIVar10[1].super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper);
    ConvertVector((IfcVector3 *)(pCVar11 + 2),in);
  }
  return pCVar11;
}

Assistant:

Curve* Curve::Convert(const IFC::Schema_2x3::IfcCurve& curve,ConversionData& conv) {
    if(curve.ToPtr<Schema_2x3::IfcBoundedCurve>()) {
        if(const Schema_2x3::IfcPolyline* c = curve.ToPtr<Schema_2x3::IfcPolyline>()) {
            return new PolyLine(*c,conv);
        }
        if(const Schema_2x3::IfcTrimmedCurve* c = curve.ToPtr<Schema_2x3::IfcTrimmedCurve>()) {
            return new TrimmedCurve(*c,conv);
        }
        if(const Schema_2x3::IfcCompositeCurve* c = curve.ToPtr<Schema_2x3::IfcCompositeCurve>()) {
            return new CompositeCurve(*c,conv);
        }
    }

    if(curve.ToPtr<Schema_2x3::IfcConic>()) {
        if(const Schema_2x3::IfcCircle* c = curve.ToPtr<Schema_2x3::IfcCircle>()) {
            return new Circle(*c,conv);
        }
        if(const Schema_2x3::IfcEllipse* c = curve.ToPtr<Schema_2x3::IfcEllipse>()) {
            return new Ellipse(*c,conv);
        }
    }

    if(const Schema_2x3::IfcLine* c = curve.ToPtr<Schema_2x3::IfcLine>()) {
        return new Line(*c,conv);
    }

    // XXX OffsetCurve2D, OffsetCurve3D not currently supported
    return NULL;
}